

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O0

int SZ_BufftoBuffCompress(void *dest,size_t *destLen,void *source,size_t sourceLen,SZ_com_t *param)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *dest_00;
  size_t in_RCX;
  void *in_RDX;
  undefined8 *in_RSI;
  long in_R8;
  bool bVar5;
  int interleave;
  int pixel_size;
  size_t padbuf_size;
  size_t scanlines;
  size_t padding_size;
  void *buf;
  void *padbuf;
  int aec_status;
  int status;
  aec_stream strm;
  int in_stack_00000144;
  void *__ptr;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar6;
  size_t in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  int pp;
  undefined8 local_48;
  int local_40;
  
  iVar6 = *(int *)(in_R8 + 8);
  iVar1 = *(int *)(in_R8 + 0xc);
  iVar2 = *(int *)(in_R8 + 8);
  iVar3 = *(int *)(in_R8 + 8);
  convert_options(in_stack_00000144);
  pp = (int)*in_RSI;
  __ptr = (void *)0x0;
  bVar5 = true;
  if (*(int *)(in_R8 + 4) != 0x20) {
    bVar5 = *(int *)(in_R8 + 4) == 0x40;
  }
  if (bVar5) {
    local_40 = 8;
    dest_00 = malloc(in_RCX);
    if (dest_00 == (void *)0x0) {
      iVar6 = -4;
      goto LAB_00101431;
    }
    interleave_buffer(dest_00,in_RDX,in_RCX,*(int *)(in_R8 + 4) / 8);
  }
  else {
    local_40 = *(int *)(in_R8 + 4);
    dest_00 = in_RDX;
  }
  iVar4 = bits_to_bytes(local_40);
  __ptr = malloc((ulong)(uint)(((iVar1 + iVar2 + -1) / iVar3) * iVar6 * iVar4) *
                 (((in_RCX / (ulong)(long)iVar4 + (long)*(int *)(in_R8 + 0xc)) - 1) /
                 (ulong)(long)*(int *)(in_R8 + 0xc)));
  if (__ptr == (void *)0x0) {
    iVar6 = -4;
  }
  else {
    add_padding(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(size_t)__ptr,
                (int)((ulong)dest_00 >> 0x20),pp);
    iVar6 = aec_buffer_encode(&stack0xffffffffffffff90);
    if (iVar6 == -2) {
      iVar6 = 2;
    }
    *in_RSI = local_48;
  }
LAB_00101431:
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if ((bVar5) && (dest_00 != (void *)0x0)) {
    free(dest_00);
  }
  return iVar6;
}

Assistant:

int SZ_BufftoBuffCompress(void *dest, size_t *destLen,
                          const void *source, size_t sourceLen,
                          SZ_com_t *param)
{
    struct aec_stream strm;
    int status;
    int aec_status;
    void *padbuf;
    void *buf;
    size_t padding_size;
    size_t scanlines;
    size_t padbuf_size;
    int pixel_size;
    int interleave;

    strm.block_size = param->pixels_per_block;
    strm.rsi = (param->pixels_per_scanline + param->pixels_per_block - 1)
        / param->pixels_per_block;
    strm.flags = AEC_NOT_ENFORCE | convert_options(param->options_mask);
    strm.avail_out = *destLen;
    strm.next_out = dest;
    buf = 0;
    padbuf = 0;

    interleave = param->bits_per_pixel == 32 || param->bits_per_pixel == 64;
    if (interleave) {
        strm.bits_per_sample = 8;
        buf = malloc(sourceLen);
        if (buf == NULL) {
            status = SZ_MEM_ERROR;
            goto CLEANUP;
        }
        interleave_buffer(buf, source, sourceLen, param->bits_per_pixel / 8);
    } else {
        strm.bits_per_sample = param->bits_per_pixel;
        buf = (void *)source;
    }

    pixel_size = bits_to_bytes(strm.bits_per_sample);

    scanlines = (sourceLen / pixel_size + param->pixels_per_scanline - 1)
        / param->pixels_per_scanline;
    padbuf_size = strm.rsi * strm.block_size * pixel_size * scanlines;
    padbuf = malloc(padbuf_size);
    if (padbuf == NULL) {
        status = SZ_MEM_ERROR;
        goto CLEANUP;
    }

    padding_size =
        (strm.rsi * strm.block_size - param->pixels_per_scanline)
        * pixel_size;

    add_padding(padbuf, buf, sourceLen,
                param->pixels_per_scanline * pixel_size,
                padding_size, pixel_size,
                strm.flags & AEC_DATA_PREPROCESS);
    strm.next_in = padbuf;
    strm.avail_in = padbuf_size;

    aec_status = aec_buffer_encode(&strm);
    if (aec_status == AEC_STREAM_ERROR)
        status = SZ_OUTBUFF_FULL;
    else
        status = aec_status;
    *destLen = strm.total_out;

CLEANUP:
    if (padbuf)
        free(padbuf);
    if (interleave && buf)
        free(buf);
    return status;
}